

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O2

void __thiscall
GMAA_MAA_ELSI::Fill_joI_Array
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  ObservationHistoryTree *pOVar3;
  undefined4 extraout_var_00;
  Index IVar4;
  ulong uVar5;
  uint uVar6;
  ObservationHistory *oh;
  vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> indOH;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  uint local_8c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,indTypes);
  uVar6 = 0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar2 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
              super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
              super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
    uVar5 = (ulong)uVar6;
    if (CONCAT44(extraout_var,iVar2) <= uVar5) break;
    IVar4 = local_48._M_impl.super__Vector_impl_data._M_start[uVar5] +
            (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    local_48._M_impl.super__Vector_impl_data._M_start[uVar5] = IVar4;
    pOVar3 = PlanningUnitMADPDiscrete::GetObservationHistoryTree
                       ((PlanningUnitMADPDiscrete *)this,uVar6,IVar4);
    local_88._M_impl.super__Vector_impl_data._M_start =
         (pointer)(pOVar3->super_TreeNode<ObservationHistory>)._m_containedElem;
    std::vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>::push_back
              ((vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> *)
               &local_68,(value_type *)&local_88);
    uVar6 = uVar6 + 1;
  }
  while( true ) {
    ts = ts - 1;
    if ((int)ts < 0) break;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = 0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      iVar2 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
                super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
                super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
      uVar5 = (ulong)uVar6;
      if (CONCAT44(extraout_var_00,iVar2) <= uVar5) break;
      local_8c = *(uint *)&(local_68._M_impl.super__Vector_impl_data._M_start[uVar5]->
                           super_IndividualHistory).field_0x14;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_8c);
      local_68._M_impl.super__Vector_impl_data._M_start[uVar5] =
           local_68._M_impl.super__Vector_impl_data._M_start[uVar5]->_m_pred;
      uVar6 = uVar6 + 1;
    }
    pMVar1 = (this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
             super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
             super_PlanningUnitMADPDiscrete._m_madp;
    IVar4 = (**(code **)((long)*pMVar1 + 0xe0))(pMVar1,&local_88);
    joI_arr[ts & 0x7fffffff] = IVar4;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  }
  std::_Vector_base<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_>::
  ~_Vector_base(&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void GMAA_MAA_ELSI::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    vector<const ObservationHistory*> indOH;
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        const ObservationHistoryTree* oht = 
            GetObservationHistoryTree(agentI, indOHI[agentI]);
        const ObservationHistory* oh = oht->GetObservationHistory();
        indOH.push_back(oh);
    }
    //convert the vector of  ind. observation history indices to a array of
    //joint observations
    for(int tI=ts-1; tI >= 0; tI--)
    {
        vector<Index> indivObservationsTI;
        for(Index agentI=0; agentI < GetNrAgents(); agentI++)
        {
            indivObservationsTI.push_back( indOH[agentI]->
                    GetLastObservationIndex() );
            indOH[agentI] =  indOH[agentI]->GetPredecessor();
        }
        joI_arr[tI] = IndividualToJointObservationIndices(
                indivObservationsTI);
    }
}